

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_ObjComputePathD(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  
  iVar1 = Acb_ObjIsCi(p,iObj);
  if (iVar1 == 0) {
    piVar4 = Acb_ObjFanins(p,iObj);
    lVar5 = 0;
    iVar1 = 0;
    while (lVar5 < *piVar4) {
      iVar3 = piVar4[lVar5 + 1];
      lVar5 = lVar5 + 1;
      iVar2 = Acb_ObjSlack(p,iVar3);
      if (iVar2 == 0) {
        iVar3 = Acb_ObjPathD(p,iVar3);
        iVar1 = iVar1 + iVar3;
      }
    }
    Vec_IntWriteEntry(&p->vPathD,iObj,iVar1);
    return iVar1;
  }
  __assert_fail("!Acb_ObjIsCi(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                ,0x193,"int Acb_ObjComputePathD(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjComputePathD( Acb_Ntk_t * p, int iObj )
{
    int * pFanins, iFanin, k, Path = 0;
    assert( !Acb_ObjIsCi(p, iObj) );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        if ( !Acb_ObjSlack(p, iFanin) )
            Path += Acb_ObjPathD(p, iFanin);
    return Acb_ObjSetPathD( p, iObj, Path );
}